

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_coroutine.hpp
# Opt level: O0

int __thiscall squall::Coroutine::result<int>(Coroutine *this)

{
  int iVar1;
  undefined1 local_20 [8];
  RestoreStack r;
  Coroutine *this_local;
  
  r.top_ = (SQInteger)this;
  validate_vm(this);
  RestoreStack::RestoreStack((RestoreStack *)local_20,&this->vm_,this->top_);
  iVar1 = detail::call_teardown<int>(this->vm_);
  RestoreStack::~RestoreStack((RestoreStack *)local_20);
  return iVar1;
}

Assistant:

R result() {
        validate_vm();
        RestoreStack r(vm_, top_);
        return detail::call_teardown<R>(vm_);
    }